

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

Type * slang::ast::FixedSizeUnpackedArrayType::fromDim
                 (Scope *scope,Type *elementType,ConstantRange dim,DeferredSourceRange sourceRange)

{
  bool bVar1;
  Type *args;
  BumpAllocator *this;
  unsigned_long *args_2;
  FixedSizeUnpackedArrayType *this_00;
  SyntaxNode *node;
  Type *in_RSI;
  Scope *in_RDI;
  optional<unsigned_long> oVar2;
  SyntaxNode *syntax;
  FixedSizeUnpackedArrayType *result;
  optional<unsigned_long> bitstreamWidth;
  optional<unsigned_long> selectableWidth;
  Compilation *comp;
  SourceRange in_stack_000000a0;
  Type *in_stack_ffffffffffffff68;
  ConstantRange *in_stack_ffffffffffffff70;
  __unspec local_4c;
  type local_4b;
  __unspec local_4a;
  type local_49;
  _Storage<unsigned_long,_true> local_48;
  undefined1 local_40;
  _Storage<unsigned_long,_true> local_38;
  undefined1 local_30;
  Compilation *local_28;
  Type *local_20;
  Scope *local_18;
  Type *local_8;
  
  local_20 = in_RSI;
  local_18 = in_RDI;
  bVar1 = Type::isError((Type *)0x10e20f9);
  if (bVar1) {
    local_8 = local_20;
  }
  else {
    local_28 = Scope::getCompilation(local_18);
    args = (Type *)Type::getSelectableWidth(in_stack_ffffffffffffff68);
    ConstantRange::width((ConstantRange *)0x10e2148);
    oVar2 = checkedMulU64((uint64_t)in_stack_ffffffffffffff70,(uint64_t)in_stack_ffffffffffffff68);
    local_38._M_value =
         oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_30 = oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
    this = (BumpAllocator *)Type::getBitstreamWidth(in_stack_ffffffffffffff68);
    ConstantRange::width((ConstantRange *)0x10e217e);
    oVar2 = checkedMulU64((uint64_t)in_stack_ffffffffffffff70,(uint64_t)in_stack_ffffffffffffff68);
    local_48._M_value =
         oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_40 = oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
    bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0x10e219f);
    if (bVar1) {
      local_49 = (type)std::operator<=><unsigned_long,_unsigned_long>
                                 ((optional<unsigned_long> *)args,
                                  (unsigned_long *)in_stack_ffffffffffffff70);
      std::__cmp_cat::__unspec::__unspec(&local_4a,(__unspec *)0x0);
      bVar1 = std::operator>(local_49);
      if ((!bVar1) &&
         (bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0x10e21e0), bVar1)
         ) {
        local_4b = (type)std::operator<=><unsigned_long,_unsigned_long>
                                   ((optional<unsigned_long> *)args,
                                    (unsigned_long *)in_stack_ffffffffffffff70);
        std::__cmp_cat::__unspec::__unspec(&local_4c,(__unspec *)0x0);
        bVar1 = std::operator>(local_4b);
        if (!bVar1) {
          args_2 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x10e2299);
          std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x10e22a8);
          this_00 = BumpAllocator::
                    emplace<slang::ast::FixedSizeUnpackedArrayType,slang::ast::Type_const&,slang::ConstantRange&,unsigned_long&,unsigned_long&>
                              (this,args,in_stack_ffffffffffffff70,args_2,(unsigned_long *)local_20)
          ;
          node = slang::syntax::DeferredSourceRange::syntax((DeferredSourceRange *)0x10e22d5);
          if (node == (SyntaxNode *)0x0) {
            return &this_00->super_Type;
          }
          Symbol::setSyntax((Symbol *)this_00,node);
          return &this_00->super_Type;
        }
      }
    }
    slang::syntax::DeferredSourceRange::get((DeferredSourceRange *)args);
    Scope::addDiag((Scope *)dim,(DiagCode)sourceRange.range.startLoc._4_4_,in_stack_000000a0);
    local_8 = Compilation::getErrorType(local_28);
  }
  return local_8;
}

Assistant:

const Type& FixedSizeUnpackedArrayType::fromDim(const Scope& scope, const Type& elementType,
                                                ConstantRange dim,
                                                DeferredSourceRange sourceRange) {
    if (elementType.isError())
        return elementType;

    auto& comp = scope.getCompilation();
    auto selectableWidth = checkedMulU64(elementType.getSelectableWidth(), dim.width());
    auto bitstreamWidth = checkedMulU64(elementType.getBitstreamWidth(), dim.width());

    if (!selectableWidth || selectableWidth > MaxBitWidth || !bitstreamWidth ||
        bitstreamWidth > MaxBitWidth) {
        scope.addDiag(diag::ObjectTooLarge, sourceRange.get());
        return comp.getErrorType();
    }

    auto result = comp.emplace<FixedSizeUnpackedArrayType>(elementType, dim, *selectableWidth,
                                                           *bitstreamWidth);
    if (auto syntax = sourceRange.syntax())
        result->setSyntax(*syntax);

    return *result;
}